

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_int_noinline<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,
          write_int_arg<unsigned___int128> arg,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  size_t sVar2;
  ulong uVar3;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar4;
  int iVar5;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar6;
  byte *pbVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  char *digits_1;
  char *pcVar12;
  char *pcVar13;
  detail *pdVar14;
  long lVar15;
  long lVar16;
  buffer<char8_t> *buf;
  bool bVar17;
  bool bVar18;
  format_decimal_result<char8_t_*> fVar19;
  undefined8 in_stack_ffffffffffffff28;
  write_int_data<char8_t> local_c8;
  undefined1 local_b8 [40];
  ulong local_90;
  int local_88;
  bool local_84;
  
  pVar1 = specs->type;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) != 0) &&
       (value._8_8_ = out.container, value._0_8_ = in_stack_ffffffffffffff28,
       bVar17 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128,char8_t>
                          ((detail *)&stack0xffffffffffffff30,
                           (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)
                           (detail *)arg.abs_value,(unsigned___int128)value,arg.abs_value._8_4_,
                           (basic_format_specs<char8_t> *)(ulong)arg.prefix,(locale_ref)specs),
       bVar17)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
    }
    n._8_8_ = out.container;
    n._0_8_ = in_stack_ffffffffffffff28;
    iVar5 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,iVar5,arg.prefix,specs);
      local_b8._0_4_ = arg.prefix;
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_88 = iVar5;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
    }
    if (-1 < iVar5) {
      bVar6.container = out.container;
      if ((arg.prefix != 0) &&
         (((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
        uVar9 = (out.container)->size_;
        uVar11 = arg.prefix & 0xffffff;
        do {
          uVar3 = uVar9 + 1;
          uVar10 = uVar9;
          uVar9 = uVar3;
          if ((out.container)->capacity_ < uVar3) {
            (**(out.container)->_vptr_buffer)(out.container);
            uVar10 = (out.container)->size_;
            uVar9 = uVar10 + 1;
          }
          (out.container)->size_ = uVar9;
          (out.container)->ptr_[uVar10] = (char8_t)uVar11;
          bVar17 = 0xff < uVar11;
          uVar11 = uVar11 >> 8;
        } while (bVar17);
      }
      value_00._8_8_ = bVar6.container;
      value_00._0_8_ = in_stack_ffffffffffffff28;
      fVar19 = format_decimal<char8_t,unsigned__int128>
                         ((detail *)local_b8,(char8_t *)(detail *)arg.abs_value,
                          (unsigned___int128)value_00,arg.abs_value._8_4_);
      bVar6 = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                        ((char8_t *)local_b8,fVar19.end,out);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    uVar9 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar3 = uVar9 << 0x3d;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0x7 < pdVar14;
      bVar18 = uVar9 != 0;
      uVar10 = -uVar9;
      uVar9 = uVar9 >> 3;
      pdVar14 = (detail *)(uVar3 | (ulong)pdVar14 >> 3);
    } while (bVar18 || uVar10 < bVar17);
    iVar5 = (int)lVar15;
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iVar5)) {
      uVar11 = 0x3000;
      if (arg.prefix == 0) {
        uVar11 = 0x30;
      }
      arg.prefix = (uVar11 | arg.prefix) + 0x1000000;
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,iVar5,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = iVar5;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
    }
    if ((arg.prefix != 0) && ((arg.prefix & 0xffffff) != 0)) {
      uVar9 = (out.container)->size_;
      uVar11 = arg.prefix & 0xffffff;
      do {
        uVar3 = uVar9 + 1;
        uVar10 = uVar9;
        uVar9 = uVar3;
        if ((out.container)->capacity_ < uVar3) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar10 = (out.container)->size_;
          uVar9 = uVar10 + 1;
        }
        (out.container)->size_ = uVar9;
        (out.container)->ptr_[uVar10] = (char8_t)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    sVar2 = (out.container)->size_;
    uVar9 = sVar2 + lVar15;
    if (uVar9 <= (out.container)->capacity_) {
      (out.container)->size_ = uVar9;
      if ((out.container)->ptr_ != (char8_t *)0x0) {
        pbVar7 = (byte *)((out.container)->ptr_ + lVar15 + sVar2);
        do {
          pbVar7 = pbVar7 + -1;
          uVar9 = arg.abs_value._8_8_ << 0x3d;
          *pbVar7 = (byte)(detail *)arg.abs_value & 7 | 0x30;
          bVar17 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
          arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 3);
        } while (bVar17);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
      }
    }
    pbVar7 = local_b8 + lVar16;
    pcVar8 = local_b8 + lVar16 + 1;
    do {
      *pbVar7 = (byte)(detail *)arg.abs_value & 7 | 0x30;
      uVar9 = arg.abs_value._8_8_ << 0x3d;
      pbVar7 = pbVar7 + -1;
      bVar17 = (detail *)0x7 < (detail *)arg.abs_value;
      bVar18 = arg.abs_value._8_8_ != 0;
      uVar3 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
      arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 3);
    } while (bVar18 || uVar3 < bVar17);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar11 = uVar4 << 8;
      if (arg.prefix == 0) {
        uVar11 = uVar4;
      }
      arg.prefix = (uVar11 | arg.prefix) + 0x2000000;
    }
    uVar9 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar3 = uVar9 << 0x3c;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0xf < pdVar14;
      bVar18 = uVar9 != 0;
      uVar10 = -uVar9;
      uVar9 = uVar9 >> 4;
      pdVar14 = (detail *)(uVar3 | (ulong)pdVar14 >> 4);
    } while (bVar18 || uVar10 < bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,(int)lVar15,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = (int)lVar15;
      local_84 = pVar1 == hex_upper;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
    }
    if ((arg.prefix != 0) && ((arg.prefix & 0xffffff) != 0)) {
      uVar9 = (out.container)->size_;
      uVar11 = arg.prefix & 0xffffff;
      do {
        uVar3 = uVar9 + 1;
        uVar10 = uVar9;
        uVar9 = uVar3;
        if ((out.container)->capacity_ < uVar3) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar10 = (out.container)->size_;
          uVar9 = uVar10 + 1;
        }
        (out.container)->size_ = uVar9;
        (out.container)->ptr_[uVar10] = (char8_t)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    sVar2 = (out.container)->size_;
    uVar9 = sVar2 + lVar15;
    if (uVar9 <= (out.container)->capacity_) {
      (out.container)->size_ = uVar9;
      if ((out.container)->ptr_ != (char8_t *)0x0) {
        pcVar8 = "0123456789abcdef";
        if (pVar1 == hex_upper) {
          pcVar8 = "0123456789ABCDEF";
        }
        pcVar12 = (out.container)->ptr_ + lVar15 + sVar2;
        do {
          pcVar12 = pcVar12 + -1;
          uVar9 = arg.abs_value._8_8_ << 0x3c;
          *pcVar12 = pcVar8[(uint)(detail *)arg.abs_value & 0xf];
          bVar17 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
          arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 4);
        } while (bVar17);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
      }
    }
    pcVar12 = local_b8 + lVar16;
    pcVar8 = local_b8 + lVar16 + 1;
    pcVar13 = "0123456789abcdef";
    if (pVar1 == hex_upper) {
      pcVar13 = "0123456789ABCDEF";
    }
    do {
      *pcVar12 = pcVar13[(uint)(detail *)arg.abs_value & 0xf];
      pcVar12 = pcVar12 + -1;
      bVar17 = (detail *)0xf < (detail *)arg.abs_value;
      bVar18 = arg.abs_value._8_8_ != 0;
      uVar9 = -arg.abs_value._8_8_;
      arg.abs_value._0_8_ =
           (detail *)(arg.abs_value._8_8_ << 0x3c | (ulong)(detail *)arg.abs_value >> 4);
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
    } while (bVar18 || uVar9 < bVar17);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar11 = uVar4 << 8;
      if (arg.prefix == 0) {
        uVar11 = uVar4;
      }
      arg.prefix = (uVar11 | arg.prefix) + 0x2000000;
    }
    uVar9 = arg.abs_value._8_8_;
    pdVar14 = (detail *)arg.abs_value;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      uVar3 = uVar9 << 0x3f;
      lVar15 = lVar16 + 1;
      bVar17 = (detail *)0x1 < pdVar14;
      bVar18 = uVar9 != 0;
      uVar10 = -uVar9;
      uVar9 = uVar9 >> 1;
      pdVar14 = (detail *)(uVar3 | (ulong)pdVar14 >> 1);
    } while (bVar18 || uVar10 < bVar17);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,(int)lVar15,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = (int)lVar15;
      bVar6 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
    }
    if ((arg.prefix != 0) && ((arg.prefix & 0xffffff) != 0)) {
      uVar9 = (out.container)->size_;
      uVar11 = arg.prefix & 0xffffff;
      do {
        uVar3 = uVar9 + 1;
        uVar10 = uVar9;
        uVar9 = uVar3;
        if ((out.container)->capacity_ < uVar3) {
          (**(out.container)->_vptr_buffer)(out.container);
          uVar10 = (out.container)->size_;
          uVar9 = uVar10 + 1;
        }
        (out.container)->size_ = uVar9;
        (out.container)->ptr_[uVar10] = (char8_t)uVar11;
        bVar17 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar17);
    }
    sVar2 = (out.container)->size_;
    uVar9 = sVar2 + lVar15;
    if (uVar9 <= (out.container)->capacity_) {
      (out.container)->size_ = uVar9;
      if ((out.container)->ptr_ != (char8_t *)0x0) {
        pbVar7 = (byte *)((out.container)->ptr_ + lVar15 + sVar2);
        do {
          pbVar7 = pbVar7 + -1;
          uVar9 = arg.abs_value._8_8_ << 0x3f;
          *pbVar7 = (byte)(detail *)arg.abs_value & 1 | 0x30;
          bVar17 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
          arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
          arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 1);
        } while (bVar17);
        return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
      }
    }
    pbVar7 = local_b8 + lVar16;
    pcVar8 = local_b8 + lVar16 + 1;
    do {
      *pbVar7 = (byte)(detail *)arg.abs_value & 1 | 0x30;
      uVar9 = arg.abs_value._8_8_ << 0x3f;
      pbVar7 = pbVar7 + -1;
      bVar17 = (detail *)0x1 < (detail *)arg.abs_value;
      bVar18 = arg.abs_value._8_8_ != 0;
      uVar3 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
      arg.abs_value._0_8_ = (detail *)(uVar9 | (ulong)(detail *)arg.abs_value >> 1);
    } while (bVar18 || uVar3 < bVar17);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_b8[0] = (char)arg.abs_value;
    bVar6 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_char<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::basic_format_specs<char8_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                      (out,specs,1,1,(anon_class_1_1_a8c68091 *)local_b8);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
  }
  bVar6 = copy_str_noinline<char8_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                    (local_b8,pcVar8,out);
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar6.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}